

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O0

int ncnn::gemm_AT_x86(Mat *AT,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int M,int K,
                     int transB,int output_transpose,int constant_TILE_M,int constant_TILE_N,
                     int constant_TILE_K,int nT,Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  void **in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000038;
  bool k_end;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  Mat *CT_tile;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int i;
  int ppi;
  Mat topT;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int N;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  undefined1 in_stack_00001013;
  int in_stack_00001014;
  Mat *in_stack_00001018;
  Mat *in_stack_00001020;
  Mat *in_stack_00001028;
  Mat *in_stack_00001030;
  Mat *in_stack_00001038;
  undefined4 in_stack_fffffffffffff4e4;
  undefined4 in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  int in_stack_fffffffffffff4f4;
  int in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff4fc;
  Mat *in_stack_fffffffffffff500;
  undefined8 in_stack_fffffffffffff540;
  void **ppvVar4;
  undefined8 in_stack_fffffffffffff548;
  int in_stack_fffffffffffff550;
  int in_stack_fffffffffffff554;
  int *in_stack_fffffffffffff560;
  int *in_stack_fffffffffffff568;
  int *in_stack_fffffffffffff570;
  int in_stack_fffffffffffff578;
  void **local_a58;
  bool local_995;
  int local_994;
  int local_990;
  undefined8 local_988;
  undefined8 local_980;
  undefined8 local_978;
  undefined4 local_970;
  Allocator *local_968;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined8 local_948;
  void *local_940;
  int *local_938;
  size_t local_930;
  int local_928;
  Allocator *local_920;
  undefined4 local_918;
  int local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  long local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined4 local_8e0;
  long *local_8d8;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined8 local_8b8;
  void *local_8b0;
  int *local_8a8;
  long local_8a0;
  undefined4 local_898;
  long *local_890;
  undefined4 local_888;
  int local_884;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  long local_870;
  int local_864;
  int local_860;
  int local_85c;
  void **local_858;
  int local_84c;
  int local_848;
  int local_844;
  void *local_840;
  int *local_838;
  Mat *local_830;
  undefined4 local_828;
  long *local_820;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined8 local_800;
  void *local_7f8;
  int *local_7f0;
  Mat *local_7e8;
  undefined4 local_7e0;
  long *local_7d8;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 local_7c0;
  undefined8 local_7b8;
  int local_7b0;
  int local_7ac;
  int iVar5;
  void *__ptr;
  Mat *AT_00;
  Mat *A;
  undefined8 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined4 local_740;
  Allocator *local_738;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  undefined8 local_718;
  Mat local_710;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  int local_6a8;
  int local_6a4;
  undefined4 local_6a0;
  void *local_690;
  int *local_688;
  size_t local_680;
  int local_678;
  Allocator *local_670;
  undefined4 local_668;
  int local_664;
  undefined4 local_660;
  undefined4 local_65c;
  int local_658;
  long local_650;
  int local_644;
  int local_640;
  int local_63c;
  int local_638;
  int local_634;
  int local_630;
  int local_62c;
  int local_628;
  int local_624;
  void **local_618;
  long *local_608;
  int local_5fc;
  undefined1 *local_5f8;
  void **local_5f0;
  undefined8 *local_5e8;
  Mat *local_5d8;
  void **local_5c8;
  undefined8 *local_5b8;
  undefined8 *local_5a8;
  void **local_598;
  void **local_588;
  void **local_578;
  undefined1 *local_568;
  void **local_558;
  undefined1 *local_548;
  void **local_540;
  undefined1 local_535;
  int local_534;
  void **local_530;
  undefined8 *local_528;
  undefined1 local_515;
  int local_514;
  undefined1 *local_510;
  void **local_508;
  undefined1 local_4f5;
  int local_4f4;
  void **local_4f0;
  undefined8 *local_4e8;
  undefined4 local_4d8;
  int local_4d4;
  undefined8 *local_4d0;
  void **local_4c8;
  undefined4 local_4c0;
  int local_4bc;
  undefined8 *local_4b8;
  int in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  int in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  Mat *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  
  if (in_stack_00000010 == 0) {
    local_994 = *(int *)(in_RSI + 0x2c);
  }
  else {
    if (*(int *)(in_RSI + 0x28) == 3) {
      local_990 = *(int *)(in_RSI + 0x38);
    }
    else {
      local_990 = *(int *)(in_RSI + 0x30);
    }
    local_994 = local_990 * *(int *)(in_RSI + 0x18);
  }
  local_62c = local_994;
  local_628 = in_R9D;
  local_624 = in_R8D;
  local_618 = in_RDX;
  local_608 = in_RDI;
  get_optimal_tile_mnk
            (in_stack_fffffffffffff554,in_stack_fffffffffffff550,
             (int)((ulong)in_stack_fffffffffffff548 >> 0x20),(int)in_stack_fffffffffffff548,
             (int)((ulong)in_stack_fffffffffffff540 >> 0x20),(int)in_stack_fffffffffffff540,
             in_stack_fffffffffffff560,in_stack_fffffffffffff568,in_stack_fffffffffffff570,
             in_stack_fffffffffffff578);
  local_63c = (local_628 + local_630 + -1) / local_630;
  local_640 = (local_62c + local_634 + -1) / local_634;
  local_644 = (in_stack_00000008 + local_638 + -1) / local_638;
  local_690 = (void *)0x0;
  local_688 = (int *)0x0;
  local_680 = 0;
  local_678 = 0;
  local_670 = (Allocator *)0x0;
  local_668 = 0;
  local_664 = 0;
  local_660 = 0;
  local_65c = 0;
  local_658 = 0;
  local_650 = 0;
  Mat::create(in_stack_fffffffffffff500,in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8,
              in_stack_fffffffffffff4f4,
              CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
              (Allocator *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_00000038));
  local_540 = &local_690;
  local_995 = local_690 == (void *)0x0 || local_650 * local_658 == 0;
  if (local_995) {
    local_5fc = -100;
    local_6a0 = 1;
  }
  else {
    local_6a4 = local_640 * local_644;
    for (local_6a8 = 0; local_6a8 < local_6a4; local_6a8 = local_6a8 + 1) {
      local_6ac = local_6a8 / local_644;
      local_6b0 = local_6a8 % local_644;
      local_6b4 = local_6ac * local_634;
      local_6b8 = local_6b0 * local_638;
      local_6c0 = local_62c - local_6b4;
      piVar3 = std::min<int>(&local_6c0,&local_634);
      local_6bc = *piVar3;
      local_6c8 = in_stack_00000008 - local_6b8;
      piVar3 = std::min<int>(&local_6c8,&local_638);
      local_6c4 = *piVar3;
      local_4f4 = local_6b4 / local_634;
      local_4e8 = &local_758;
      local_4f0 = &local_690;
      local_4bc = local_6b8 / local_638;
      local_4b8 = &local_758;
      local_710.data =
           (void *)((long)local_690 +
                   (long)local_664 * (long)local_4bc * local_680 + local_650 * local_4f4 * local_680
                   );
      local_710.cstep = (size_t)local_664;
      local_5e8 = &local_758;
      local_710.c = 1;
      local_710.d = 1;
      local_710.h = 1;
      local_710.w = local_664;
      local_710.dims = 2;
      local_710.allocator = local_670;
      local_710.elempack = local_678;
      local_710.elemsize = local_680;
      local_710.refcount = (int *)0x0;
      local_738 = local_670;
      local_4c0 = 1;
      local_4f5 = 1;
      local_758 = 0;
      local_748 = 0;
      local_740 = 0;
      local_730 = 0;
      local_72c = 0;
      local_728 = 0;
      local_724 = 0;
      local_720 = 0;
      local_718 = 0;
      local_750 = 0;
      if (in_stack_00000010 == 0) {
        transpose_pack_B_tile
                  (in_stack_fffffffffffffca0,
                   (Mat *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                   in_stack_fffffffffffffc94,in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                   in_stack_fffffffffffffc88);
      }
      else {
        pack_B_tile((Mat *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                    (Mat *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                    (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),(int)in_stack_fffffffffffffd58,
                    (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),(int)in_stack_fffffffffffffd50);
      }
      local_5d8 = &local_710;
      in_stack_fffffffffffffca0 = local_5d8;
      if (local_710.refcount != (int *)0x0) {
        in_stack_fffffffffffffc9c = 0xffffffff;
        LOCK();
        in_stack_fffffffffffffc98 = *local_710.refcount;
        *local_710.refcount = *local_710.refcount + -1;
        UNLOCK();
        if (in_stack_fffffffffffffc98 == 1) {
          if (local_710.allocator == (Allocator *)0x0) {
            if (local_710.data != (void *)0x0) {
              free(local_710.data);
            }
          }
          else {
            (*(local_710.allocator)->_vptr_Allocator[3])(local_710.allocator,local_710.data);
          }
        }
      }
      local_710.data = (void *)0x0;
      local_710.elemsize = 0;
      local_710.elempack = 0;
      local_710.dims = 0;
      local_710.w = 0;
      local_710.h = 0;
      local_710.d = 0;
      local_710.c = 0;
      local_710.cstep = 0;
      local_710.refcount = (int *)0x0;
    }
    local_5f8 = &stack0xfffffffffffff860;
    __ptr = (void *)0x0;
    AT_00 = (Mat *)0x0;
    if (((local_638 < in_stack_00000008) || (local_624 == 3)) || (in_stack_00000018 != 0)) {
      Mat::create(in_stack_fffffffffffff500,in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8,
                  in_stack_fffffffffffff4f4,
                  CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                  (Allocator *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_00000038));
      local_548 = &stack0xfffffffffffff860;
      local_5fc = -100;
    }
    else {
      __ptr = (void *)0x0;
      A = (Mat *)0x0;
      AT_00 = (Mat *)0x0;
      for (iVar5 = 0; iVar5 < local_63c; iVar5 = iVar5 + 1) {
        iVar2 = iVar5 * local_630;
        local_7b0 = local_628 - iVar2;
        piVar3 = std::min<int>(&local_7b0,&local_630);
        local_7ac = *piVar3;
        local_5f0 = &local_7f8;
        local_7f8 = (void *)0x0;
        local_7f0 = (int *)0x0;
        local_7e8 = (Mat *)0x0;
        local_7e0 = 0;
        local_7d8 = (long *)0x0;
        local_7d0 = 0;
        local_7cc = 0;
        local_7c8 = 0;
        local_7c4 = 0;
        local_7c0 = 0;
        local_7b8 = 0;
        if ((local_638 < in_stack_00000008) || (local_624 == 3)) {
          local_514 = get_omp_thread_num();
          local_840 = __ptr;
          local_508 = &local_840;
          local_510 = &stack0xfffffffffffff860;
          local_838 = (int *)0x0;
          local_828 = 0;
          local_820 = (long *)0x0;
          local_814 = 0;
          local_810 = 0;
          local_80c = 1;
          local_808 = 0;
          local_800 = 0;
          local_818 = 0xffffffff;
          local_515 = 1;
          local_830 = A;
          __ptr = local_840;
          if (&local_7f8 != &local_840) {
            if (local_7f0 != (int *)0x0) {
              LOCK();
              iVar1 = *local_7f0;
              *local_7f0 = *local_7f0 + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_7d8 == (long *)0x0) {
                  if (local_7f8 != (void *)0x0) {
                    free(local_7f8);
                  }
                }
                else {
                  (**(code **)(*local_7d8 + 0x18))(local_7d8,local_7f8);
                }
              }
            }
            local_7f8 = local_840;
            local_7f0 = local_838;
            local_7e8 = local_830;
            local_7e0 = local_828;
            local_7d8 = local_820;
            local_7d0 = local_818;
            local_7cc = local_814;
            local_7c8 = local_810;
            local_7c4 = local_80c;
            local_7c0 = local_808;
            local_7b8 = local_800;
          }
          local_5c8 = &local_840;
          if (local_838 != (int *)0x0) {
            LOCK();
            iVar1 = *local_838;
            *local_838 = *local_838 + -1;
            UNLOCK();
            if (iVar1 == 1) {
              if (local_820 == (long *)0x0) {
                if (local_840 != (void *)0x0) {
                  free(local_840);
                }
              }
              else {
                (**(code **)(*local_820 + 0x18))(local_820,local_840);
              }
            }
          }
          local_840 = (void *)0x0;
          local_830 = (Mat *)0x0;
          local_828 = 0;
          local_818 = 0;
          local_814 = 0;
          local_810 = 0;
          local_80c = 0;
          local_808 = 0;
          local_800 = 0;
          local_838 = (int *)0x0;
        }
        for (local_844 = 0; local_844 < local_62c; local_844 = local_634 + local_844) {
          local_84c = local_62c - local_844;
          piVar3 = std::min<int>(&local_84c,&local_634);
          local_848 = *piVar3;
          if (local_624 == 3) {
            pack_A_tile(A,AT_00,(int)((ulong)__ptr >> 0x20),(int)__ptr,iVar5,iVar2);
          }
          if (local_624 == 3) {
            local_a58 = &local_7f8;
          }
          else {
            local_a58 = local_618;
          }
          local_858 = local_a58;
          for (local_85c = 0; local_85c < in_stack_00000008; local_85c = local_638 + local_85c) {
            local_864 = in_stack_00000008 - local_85c;
            piVar3 = std::min<int>(&local_864,&local_638);
            local_860 = *piVar3;
            local_884 = *(int *)((long)local_608 + 0x2c);
            local_8a0 = local_608[2];
            local_898 = (undefined4)local_608[3];
            local_8d8 = (long *)local_608[4];
            local_8b0 = (void *)(*local_608 +
                                 local_608[8] * (long)(iVar2 / local_630) * local_608[2] +
                                (long)local_884 * (long)(local_85c / local_638) * local_8a0);
            local_870 = (long)local_884;
            local_5b8 = &local_8f8;
            local_534 = local_844 / local_634;
            local_528 = &local_988;
            local_530 = &local_690;
            local_4d4 = local_85c / local_638;
            local_4c8 = &local_940;
            local_4d0 = &local_988;
            local_940 = (void *)((long)local_690 +
                                (long)local_664 * (long)local_4d4 * local_680 +
                                local_650 * local_534 * local_680);
            local_900 = (long)local_664;
            local_5a8 = &local_988;
            local_878 = 1;
            local_87c = 1;
            local_880 = 1;
            local_888 = 2;
            local_8a8 = (int *)0x0;
            local_8c0 = 0;
            local_8c4 = 0;
            local_8c8 = 0;
            local_8cc = 0;
            local_8e0 = 0;
            local_8e8 = 0;
            local_8f0 = 0;
            local_8f8 = 0;
            local_908 = 1;
            local_90c = 1;
            local_910 = 1;
            local_914 = local_664;
            local_918 = 2;
            local_920 = local_670;
            local_928 = local_678;
            local_930 = local_680;
            local_938 = (int *)0x0;
            local_968 = local_670;
            local_4d8 = 1;
            local_535 = 1;
            local_8b8 = 0;
            local_8d0 = 0;
            local_988 = 0;
            local_978 = 0;
            local_970 = 0;
            local_960 = 0;
            local_95c = 0;
            local_958 = 0;
            local_954 = 0;
            local_950 = 0;
            local_948 = 0;
            local_980 = 0;
            local_890 = local_8d8;
            gemm_transB_packed_tile
                      (in_stack_00001038,in_stack_00001030,in_stack_00001028,in_stack_00001020,
                       in_stack_00001018,in_stack_00001014,local_7ac,local_844,local_848,local_85c,
                       local_860,(uint)(in_stack_00000008 <= local_85c + local_638),
                       (bool)in_stack_00001013);
            ppvVar4 = &local_940;
            local_598 = ppvVar4;
            if (local_938 != (int *)0x0) {
              LOCK();
              iVar1 = *local_938;
              *local_938 = *local_938 + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_920 == (Allocator *)0x0) {
                  if (local_940 != (void *)0x0) {
                    free(local_940);
                  }
                }
                else {
                  (*local_920->_vptr_Allocator[3])(local_920,local_940);
                }
              }
            }
            *ppvVar4 = (void *)0x0;
            ppvVar4[2] = (void *)0x0;
            *(undefined4 *)(ppvVar4 + 3) = 0;
            *(undefined4 *)(ppvVar4 + 5) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
            *(undefined4 *)(ppvVar4 + 6) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
            *(undefined4 *)(ppvVar4 + 7) = 0;
            ppvVar4[8] = (void *)0x0;
            ppvVar4[1] = (void *)0x0;
            ppvVar4 = &local_8b0;
            local_588 = ppvVar4;
            if (local_8a8 != (int *)0x0) {
              LOCK();
              iVar1 = *local_8a8;
              *local_8a8 = *local_8a8 + -1;
              UNLOCK();
              if (iVar1 == 1) {
                if (local_890 == (long *)0x0) {
                  if (local_8b0 != (void *)0x0) {
                    free(local_8b0);
                  }
                }
                else {
                  (**(code **)(*local_890 + 0x18))(local_890,local_8b0);
                }
              }
            }
            *ppvVar4 = (void *)0x0;
            ppvVar4[2] = (void *)0x0;
            *(undefined4 *)(ppvVar4 + 3) = 0;
            *(undefined4 *)(ppvVar4 + 5) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
            *(undefined4 *)(ppvVar4 + 6) = 0;
            *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
            *(undefined4 *)(ppvVar4 + 7) = 0;
            ppvVar4[8] = (void *)0x0;
            ppvVar4[1] = (void *)0x0;
          }
        }
        local_578 = &local_7f8;
        if (local_7f0 != (int *)0x0) {
          LOCK();
          iVar2 = *local_7f0;
          *local_7f0 = *local_7f0 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (local_7d8 == (long *)0x0) {
              if (local_7f8 != (void *)0x0) {
                free(local_7f8);
              }
            }
            else {
              (**(code **)(*local_7d8 + 0x18))(local_7d8,local_7f8);
            }
          }
        }
        local_7f8 = (void *)0x0;
        local_7e8 = (Mat *)0x0;
        local_7e0 = 0;
        local_7d0 = 0;
        local_7cc = 0;
        local_7c8 = 0;
        local_7c4 = 0;
        local_7c0 = 0;
        local_7b8 = 0;
        local_7f0 = (int *)0x0;
      }
      local_5fc = 0;
    }
    local_6a0 = 1;
    local_568 = &stack0xfffffffffffff860;
    if (AT_00 != (Mat *)0x0) {
      LOCK();
      iVar5 = *(int *)&AT_00->data;
      *(int *)&AT_00->data = *(int *)&AT_00->data + -1;
      UNLOCK();
      if ((iVar5 == 1) && (__ptr != (void *)0x0)) {
        free(__ptr);
      }
    }
  }
  local_558 = &local_690;
  if (local_688 != (int *)0x0) {
    LOCK();
    iVar5 = *local_688;
    *local_688 = *local_688 + -1;
    UNLOCK();
    if (iVar5 == 1) {
      if (local_670 == (Allocator *)0x0) {
        if (local_690 != (void *)0x0) {
          free(local_690);
        }
      }
      else {
        (*local_670->_vptr_Allocator[3])(local_670,local_690);
      }
    }
  }
  return local_5fc;
}

Assistant:

static int gemm_AT_x86(const Mat& AT, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int M, int K, int transB, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
        {
            pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
        else
        {
            transpose_pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
    }

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}